

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Var __thiscall GlobOpt::GetConstantVar(GlobOpt *this,Opnd *opnd,Value *val)

{
  ValueInfo *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  VarConstantValueInfo *pVVar5;
  AddrOpnd *pAVar6;
  IntConstOpnd *pIVar7;
  FloatConstOpnd *pFVar8;
  Var pvVar9;
  RegOpnd *pRVar10;
  undefined4 *puVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ValueType *this_01;
  Instr *pIVar12;
  
  this_00 = val->valueInfo;
  bVar2 = ValueInfo::IsVarConstant(this_00);
  if ((bVar2) && (bVar2 = ValueType::IsPrimitive(&this_00->super_ValueType), bVar2)) {
    pVVar5 = ValueInfo::AsVarConstant(this_00);
    return pVVar5->varValue;
  }
  bVar2 = IR::Opnd::IsAddrOpnd(opnd);
  if (bVar2) {
    pAVar6 = IR::Opnd::AsAddrOpnd(opnd);
    if ((pAVar6->addrOpndKind == AddrOpndKindDynamicVar) ||
       (pAVar6->addrOpndKind == AddrOpndKindConstantVar)) {
LAB_004341ce:
      return pAVar6->m_address;
    }
  }
  else {
    bVar2 = IR::Opnd::IsIntConstOpnd(opnd);
    if (bVar2) {
      pIVar7 = IR::Opnd::AsIntConstOpnd(opnd);
      IR::IntConstOpnd::AsInt32(pIVar7);
      pIVar7 = IR::Opnd::AsIntConstOpnd(opnd);
      uVar3 = IR::IntConstOpnd::AsInt32(pIVar7);
      return (Var)((ulong)uVar3 | 0x1000000000000);
    }
    bVar2 = IR::Opnd::IsFloatConstOpnd(opnd);
    if (bVar2) {
LAB_0043421b:
      pFVar8 = IR::Opnd::AsFloatConstOpnd(opnd);
      pvVar9 = Js::JavascriptNumber::ToVar(pFVar8->m_value);
      return pvVar9;
    }
    bVar2 = IR::Opnd::IsRegOpnd(opnd);
    if (bVar2) {
      pRVar10 = IR::Opnd::AsRegOpnd(opnd);
      if ((pRVar10->m_sym->field_0x18 & 1) == 0) {
        return (Var)0x0;
      }
      if ((pRVar10->m_sym->field_5).m_instrDef == (Instr *)0x0) {
        return (Var)0x0;
      }
      this_01 = &this_00->super_ValueType;
      bVar2 = ValueType::IsBoolean(this_01);
      if (bVar2) {
        pRVar10 = IR::Opnd::AsRegOpnd(opnd);
        pIVar12 = (Instr *)0x0;
        if ((pRVar10->m_sym->field_0x18 & 1) != 0) {
          pIVar12 = (pRVar10->m_sym->field_5).m_instrDef;
        }
        if (pIVar12->m_opcode != Ld_A) {
          return (Var)0x0;
        }
        bVar2 = IR::Opnd::IsAddrOpnd(pIVar12->m_src1);
        if (bVar2) {
          pAVar6 = IR::Opnd::AsAddrOpnd(pIVar12->m_src1);
          if ((pAVar6->addrOpndKind != AddrOpndKindConstantVar) &&
             (pAVar6->addrOpndKind != AddrOpndKindDynamicVar)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x1a14,"(defInstr->GetSrc1()->AsAddrOpnd()->IsVar())",
                               "defInstr->GetSrc1()->AsAddrOpnd()->IsVar()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar11 = 0;
          }
          pAVar6 = IR::Opnd::AsAddrOpnd(pIVar12->m_src1);
          goto LAB_004341ce;
        }
      }
      else {
        bVar2 = ValueType::IsUndefined(this_01);
        if (bVar2) {
          iVar4 = (*this->func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
          return (Var)CONCAT44(extraout_var,iVar4);
        }
        bVar2 = ValueType::IsNull(this_01);
        if (bVar2) {
          iVar4 = (**this->func->m_scriptContextInfo->_vptr_ScriptContextInfo)();
          return (Var)CONCAT44(extraout_var_00,iVar4);
        }
        bVar2 = ValueType::IsFloat(this_01);
        if (bVar2) {
          pRVar10 = IR::Opnd::AsRegOpnd(opnd);
          pIVar12 = (Instr *)0x0;
          if ((pRVar10->m_sym->field_0x18 & 1) != 0) {
            pIVar12 = (pRVar10->m_sym->field_5).m_instrDef;
          }
          if ((pIVar12->m_opcode & ~ExtendedOpcodePrefix) != LdC_A_R8) {
            return (Var)0x0;
          }
          bVar2 = IR::Opnd::IsFloatConstOpnd(pIVar12->m_src1);
          if (bVar2) {
            opnd = pIVar12->m_src1;
            goto LAB_0043421b;
          }
        }
      }
    }
  }
  return (Var)0x0;
}

Assistant:

Js::Var // TODO: michhol OOP JIT, shouldn't play with Vars
GlobOpt::GetConstantVar(IR::Opnd *opnd, Value *val)
{
    ValueInfo *valueInfo = val->GetValueInfo();

    if (valueInfo->IsVarConstant() && valueInfo->IsPrimitive())
    {
        return valueInfo->AsVarConstant()->VarValue();
    }
    if (opnd->IsAddrOpnd())
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        if (addrOpnd->IsVar())
        {
            return addrOpnd->m_address;
        }
    }
    else if (opnd->IsIntConstOpnd())
    {
        if (!Js::TaggedInt::IsOverflow(opnd->AsIntConstOpnd()->AsInt32()))
        {
            return Js::TaggedInt::ToVarUnchecked(opnd->AsIntConstOpnd()->AsInt32());
        }
    }
#if FLOATVAR
    else if (opnd->IsFloatConstOpnd())
    {
        return Js::JavascriptNumber::ToVar(opnd->AsFloatConstOpnd()->m_value);
    }
#endif
    else if (opnd->IsRegOpnd() && opnd->AsRegOpnd()->m_sym->IsSingleDef())
    {
        if (valueInfo->IsBoolean())
        {
            IR::Instr * defInstr = opnd->AsRegOpnd()->m_sym->GetInstrDef();

            if (defInstr->m_opcode != Js::OpCode::Ld_A || !defInstr->GetSrc1()->IsAddrOpnd())
            {
                return nullptr;
            }
            Assert(defInstr->GetSrc1()->AsAddrOpnd()->IsVar());
            return defInstr->GetSrc1()->AsAddrOpnd()->m_address;
        }
        else if (valueInfo->IsUndefined())
        {
            return (Js::Var)this->func->GetScriptContextInfo()->GetUndefinedAddr();
        }
        else if (valueInfo->IsNull())
        {
            return (Js::Var)this->func->GetScriptContextInfo()->GetNullAddr();
        }
#if FLOATVAR
        else if (valueInfo->IsFloat())
        {
            IR::Instr * defInstr = opnd->AsRegOpnd()->m_sym->GetInstrDef();
            if ((defInstr->m_opcode == Js::OpCode::LdC_F8_R8 || defInstr->m_opcode == Js::OpCode::LdC_A_R8) && defInstr->GetSrc1()->IsFloatConstOpnd())
            {
                return Js::JavascriptNumber::ToVar(defInstr->GetSrc1()->AsFloatConstOpnd()->m_value);
            }
        }
#endif
    }

    return nullptr;
}